

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O0

void __thiscall
spvtools::opt::StructuredCFGAnalysis::AddBlocksInFunction
          (StructuredCFGAnalysis *this,Function *func)

{
  Function *func_00;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  CFG *pCVar4;
  reference root;
  reference pvVar5;
  reference ppBVar6;
  mapped_type *pmVar7;
  Instruction *this_00;
  uint32_t local_e4;
  undefined1 local_e0 [8];
  TraversalInfo new_state;
  Instruction *merge_inst;
  uint32_t local_b0;
  pair<unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo> local_ac;
  BasicBlock *local_98;
  BasicBlock *block;
  iterator __end2;
  iterator __begin2;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range2;
  vector<TraversalInfo,_std::allocator<TraversalInfo>_> state;
  undefined1 local_50 [8];
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  iterator local_28;
  Function *local_18;
  Function *func_local;
  StructuredCFGAnalysis *this_local;
  
  local_18 = func;
  func_local = (Function *)this;
  local_28 = opt::Function::begin(func);
  join_0x00000010_0x00000000_ = opt::Function::end(local_18);
  bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator==
                    (&local_28,
                     (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                     &order.
                      super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      ._M_impl._M_node._M_size);
  if (!bVar1) {
    std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
    list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)local_50
        );
    pCVar4 = IRContext::cfg(this->context_);
    func_00 = local_18;
    join_0x00000010_0x00000000_ = opt::Function::begin(local_18);
    root = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                      &state.super__Vector_base<TraversalInfo,_std::allocator<TraversalInfo>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    CFG::ComputeStructuredOrder
              (pCVar4,func_00,root,
               (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
               local_50);
    std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::vector
              ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2);
    std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::emplace_back<>
              ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2);
    pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::operator[]
                       ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2,0);
    (pvVar5->cinfo).containing_construct = 0;
    pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::operator[]
                       ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2,0);
    (pvVar5->cinfo).containing_loop = 0;
    pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::operator[]
                       ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2,0);
    (pvVar5->cinfo).containing_switch = 0;
    pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::operator[]
                       ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2,0);
    (pvVar5->cinfo).in_continue = false;
    pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::operator[]
                       ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2,0);
    pvVar5->merge_node = 0;
    pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::operator[]
                       ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2,0);
    pvVar5->continue_node = 0;
    __end2 = std::__cxx11::
             list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::begin
                       ((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                         *)local_50);
    block = (BasicBlock *)
            std::__cxx11::
            list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::end
                      ((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)local_50);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&block), bVar1) {
      ppBVar6 = std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&__end2);
      local_98 = *ppBVar6;
      pCVar4 = IRContext::cfg(this->context_);
      bVar1 = CFG::IsPseudoEntryBlock(pCVar4,local_98);
      if (!bVar1) {
        pCVar4 = IRContext::cfg(this->context_);
        bVar1 = CFG::IsPseudoExitBlock(pCVar4,local_98);
        if (!bVar1) {
          uVar2 = BasicBlock::id(local_98);
          pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::back
                             ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2);
          if (uVar2 == pvVar5->merge_node) {
            std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::pop_back
                      ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2);
          }
          uVar2 = BasicBlock::id(local_98);
          pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::back
                             ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2);
          if (uVar2 == pvVar5->continue_node) {
            pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::back
                               ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2);
            (pvVar5->cinfo).in_continue = true;
          }
          local_b0 = BasicBlock::id(local_98);
          pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::back
                             ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2);
          std::make_pair<unsigned_int,spvtools::opt::StructuredCFGAnalysis::ConstructInfo&>
                    (&local_ac,&local_b0,&pvVar5->cinfo);
          std::
          unordered_map<unsigned_int,spvtools::opt::StructuredCFGAnalysis::ConstructInfo,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::StructuredCFGAnalysis::ConstructInfo>>>
          ::emplace<std::pair<unsigned_int,spvtools::opt::StructuredCFGAnalysis::ConstructInfo>>
                    ((unordered_map<unsigned_int,spvtools::opt::StructuredCFGAnalysis::ConstructInfo,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::StructuredCFGAnalysis::ConstructInfo>>>
                      *)&this->bb_to_construct_,&local_ac);
          new_state._16_8_ = BasicBlock::GetMergeInst(local_98);
          if ((Instruction *)new_state._16_8_ != (Instruction *)0x0) {
            new_state.cinfo.containing_switch =
                 opt::Instruction::GetSingleWordInOperand((Instruction *)new_state._16_8_,0);
            local_e0._0_4_ = BasicBlock::id(local_98);
            OVar3 = opt::Instruction::opcode((Instruction *)new_state._16_8_);
            if (OVar3 == OpLoopMerge) {
              local_e0._4_4_ = BasicBlock::id(local_98);
              new_state.cinfo.containing_construct = 0;
              new_state.cinfo._12_4_ =
                   opt::Instruction::GetSingleWordInOperand((Instruction *)new_state._16_8_,1);
              uVar2 = BasicBlock::id(local_98);
              if (uVar2 == new_state.cinfo._12_4_) {
                new_state.cinfo.containing_loop._0_1_ = 1;
                local_e4 = BasicBlock::id(local_98);
                pmVar7 = std::
                         unordered_map<unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>_>_>
                         ::operator[](&this->bb_to_construct_,&local_e4);
                pmVar7->in_continue = true;
              }
              else {
                new_state.cinfo.containing_loop._0_1_ = 0;
              }
            }
            else {
              pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::back
                                 ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2
                                 );
              local_e0._4_4_ = (pvVar5->cinfo).containing_loop;
              pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::back
                                 ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2
                                 );
              new_state.cinfo.containing_loop._0_1_ = (pvVar5->cinfo).in_continue & 1;
              pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::back
                                 ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2
                                 );
              new_state.cinfo._12_4_ = pvVar5->continue_node;
              this_00 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                                  ((IntrusiveNodeBase<spvtools::opt::Instruction> *)new_state._16_8_
                                  );
              OVar3 = opt::Instruction::opcode(this_00);
              if (OVar3 == OpSwitch) {
                new_state.cinfo.containing_construct = BasicBlock::id(local_98);
              }
              else {
                pvVar5 = std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::back
                                   ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)
                                    &__range2);
                new_state.cinfo.containing_construct = (pvVar5->cinfo).containing_switch;
              }
            }
            std::
            vector<spvtools::opt::StructuredCFGAnalysis::AddBlocksInFunction(spvtools::opt::Function*)::TraversalInfo,std::allocator<spvtools::opt::StructuredCFGAnalysis::AddBlocksInFunction(spvtools::opt::Function*)::TraversalInfo>>
            ::
            emplace_back<spvtools::opt::StructuredCFGAnalysis::AddBlocksInFunction(spvtools::opt::Function*)::TraversalInfo&>
                      ((vector<spvtools::opt::StructuredCFGAnalysis::AddBlocksInFunction(spvtools::opt::Function*)::TraversalInfo,std::allocator<spvtools::opt::StructuredCFGAnalysis::AddBlocksInFunction(spvtools::opt::Function*)::TraversalInfo>>
                        *)&__range2,(TraversalInfo *)local_e0);
            utils::BitVector::Set(&this->merge_blocks_,new_state.cinfo.containing_switch);
          }
        }
      }
      std::_List_iterator<spvtools::opt::BasicBlock_*>::operator++(&__end2);
    }
    std::vector<TraversalInfo,_std::allocator<TraversalInfo>_>::~vector
              ((vector<TraversalInfo,_std::allocator<TraversalInfo>_> *)&__range2);
    std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
    ~list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
          local_50);
  }
  return;
}

Assistant:

void StructuredCFGAnalysis::AddBlocksInFunction(Function* func) {
  if (func->begin() == func->end()) return;

  std::list<BasicBlock*> order;
  context_->cfg()->ComputeStructuredOrder(func, &*func->begin(), &order);

  struct TraversalInfo {
    ConstructInfo cinfo;
    uint32_t merge_node;
    uint32_t continue_node;
  };

  // Set up a stack to keep track of currently active constructs.
  std::vector<TraversalInfo> state;
  state.emplace_back();
  state[0].cinfo.containing_construct = 0;
  state[0].cinfo.containing_loop = 0;
  state[0].cinfo.containing_switch = 0;
  state[0].cinfo.in_continue = false;
  state[0].merge_node = 0;
  state[0].continue_node = 0;

  for (BasicBlock* block : order) {
    if (context_->cfg()->IsPseudoEntryBlock(block) ||
        context_->cfg()->IsPseudoExitBlock(block)) {
      continue;
    }

    if (block->id() == state.back().merge_node) {
      state.pop_back();
    }

    // This works because the structured order is designed to keep the blocks in
    // the continue construct between the continue header and the merge node.
    if (block->id() == state.back().continue_node) {
      state.back().cinfo.in_continue = true;
    }

    bb_to_construct_.emplace(std::make_pair(block->id(), state.back().cinfo));

    if (Instruction* merge_inst = block->GetMergeInst()) {
      TraversalInfo new_state;
      new_state.merge_node =
          merge_inst->GetSingleWordInOperand(kMergeNodeIndex);
      new_state.cinfo.containing_construct = block->id();

      if (merge_inst->opcode() == spv::Op::OpLoopMerge) {
        new_state.cinfo.containing_loop = block->id();
        new_state.cinfo.containing_switch = 0;
        new_state.continue_node =
            merge_inst->GetSingleWordInOperand(kContinueNodeIndex);
        if (block->id() == new_state.continue_node) {
          new_state.cinfo.in_continue = true;
          bb_to_construct_[block->id()].in_continue = true;
        } else {
          new_state.cinfo.in_continue = false;
        }
      } else {
        new_state.cinfo.containing_loop = state.back().cinfo.containing_loop;
        new_state.cinfo.in_continue = state.back().cinfo.in_continue;
        new_state.continue_node = state.back().continue_node;

        if (merge_inst->NextNode()->opcode() == spv::Op::OpSwitch) {
          new_state.cinfo.containing_switch = block->id();
        } else {
          new_state.cinfo.containing_switch =
              state.back().cinfo.containing_switch;
        }
      }

      state.emplace_back(new_state);
      merge_blocks_.Set(new_state.merge_node);
    }
  }
}